

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void cortex_a7_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  ARMCPU *cpu;
  CPUState *obj_local;
  uc_struct_conflict1 *uc_local;
  
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0xd);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),8);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0xb);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x12);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x14);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x1f);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x20);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x21);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x23);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x410fc075;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x647) = 0x41023075;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x63a) = 0x10110222;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31d4) = 0x11111111;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0x84448003;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x648) = 0xc50078;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x3244) = 0x1131;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x649) = 0x11011;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31dc) = 0x2010555;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 0;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31bc) = 0x10101105;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x638) = 0x40000000;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31c4) = 0x1240000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x639) = 0x2102211;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x634) = 0x2101110;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31a4) = 0x13112111;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x635) = 0x21232041;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31ac) = 0x11112131;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x636) = 0x10011142;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x63c) = 0x3515f005;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64f) = 0xa200023;
  obj[1].tb_jmp_cache[0x651] = (TranslationBlock *)0x701fe00a;
  obj[1].tb_jmp_cache[0x652] = (TranslationBlock *)0x201fe00a;
  obj[1].tb_jmp_cache[0x653] = (TranslationBlock *)0x711fe07a;
  define_arm_cp_regs((ARMCPU *)obj,cortexa15_cp_reginfo);
  return;
}

Assistant:

static void cortex_a7_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V7VE);
    set_feature(&cpu->env, ARM_FEATURE_NEON);
    set_feature(&cpu->env, ARM_FEATURE_THUMB2EE);
    set_feature(&cpu->env, ARM_FEATURE_GENERIC_TIMER);
    set_feature(&cpu->env, ARM_FEATURE_DUMMY_C15_REGS);
    set_feature(&cpu->env, ARM_FEATURE_CBAR_RO);
    set_feature(&cpu->env, ARM_FEATURE_EL2);
    set_feature(&cpu->env, ARM_FEATURE_EL3);
    set_feature(&cpu->env, ARM_FEATURE_PMU);
    cpu->midr = 0x410fc075;
    cpu->reset_fpsid = 0x41023075;
    cpu->isar.mvfr0 = 0x10110222;
    cpu->isar.mvfr1 = 0x11111111;
    cpu->ctr = 0x84448003;
    cpu->reset_sctlr = 0x00c50078;
    cpu->id_pfr0 = 0x00001131;
    cpu->id_pfr1 = 0x00011011;
    cpu->isar.id_dfr0 = 0x02010555;
    cpu->id_afr0 = 0x00000000;
    cpu->isar.id_mmfr0 = 0x10101105;
    cpu->isar.id_mmfr1 = 0x40000000;
    cpu->isar.id_mmfr2 = 0x01240000;
    cpu->isar.id_mmfr3 = 0x02102211;
    /* a7_mpcore_r0p5_trm, page 4-4 gives 0x01101110; but
     * table 4-41 gives 0x02101110, which includes the arm div insns.
     */
    cpu->isar.id_isar0 = 0x02101110;
    cpu->isar.id_isar1 = 0x13112111;
    cpu->isar.id_isar2 = 0x21232041;
    cpu->isar.id_isar3 = 0x11112131;
    cpu->isar.id_isar4 = 0x10011142;
    cpu->isar.dbgdidr = 0x3515f005;
    cpu->clidr = 0x0a200023;
    cpu->ccsidr[0] = 0x701fe00a; /* 32K L1 dcache */
    cpu->ccsidr[1] = 0x201fe00a; /* 32K L1 icache */
    cpu->ccsidr[2] = 0x711fe07a; /* 4096K L2 unified cache */
    define_arm_cp_regs(cpu, cortexa15_cp_reginfo); /* Same as A15 */
}